

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.cpp
# Opt level: O3

void NativeCodeData::AddFixupEntryForPointerArray(void *startAddress,DataChunk *chunkList)

{
  void *data;
  code *pcVar1;
  DataChunk *pDVar2;
  bool bVar3;
  uint uVar4;
  DataChunk *pDVar5;
  undefined4 *puVar6;
  DataChunk *pDVar7;
  HANDLE hHeap;
  NativeDataFixupEntry *pNVar8;
  DataChunk *pDVar9;
  ulong uVar10;
  
  pDVar5 = GetDataChunk(startAddress);
  uVar4 = pDVar5->len;
  if ((uVar4 & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x61,"(chunk->len % sizeof(void*) == 0)","chunk->len % sizeof(void*) == 0");
    if (!bVar3) {
LAB_005f3c6d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    uVar4 = pDVar5->len;
  }
  if (7 < uVar4) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar10 = 0;
    do {
      data = *(void **)((long)startAddress + uVar10 * 8);
      if (data != (void *)0x0) {
        pDVar7 = GetDataChunk(data);
        pDVar2 = chunkList;
        if (chunkList == (DataChunk *)0x0) {
LAB_005f3b8d:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                             ,0x76,"(foundTargetChunk)",
                             "current pointer is not allocated with NativeCodeData allocator?");
          if (!bVar3) goto LAB_005f3c6d;
          *puVar6 = 0;
        }
        else {
          do {
            pDVar9 = pDVar2;
            if (pDVar9 == pDVar7) break;
            pDVar2 = pDVar9->next;
          } while (pDVar9->next != (DataChunk *)0x0);
          if (pDVar9 != pDVar7) goto LAB_005f3b8d;
        }
        hHeap = GetProcessHeap();
        pNVar8 = (NativeDataFixupEntry *)HeapAlloc(hHeap,0,0x10);
        if (pNVar8 == (NativeDataFixupEntry *)0x0) {
          Js::Throw::OutOfMemory();
        }
        pNVar8->addrOffset = (int)uVar10 * 8;
        pNVar8->targetTotalOffset = pDVar7->offset;
        pNVar8->next = pDVar5->fixupList;
        pDVar5->fixupList = pNVar8;
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,NativeCodeDataPhase);
        if (bVar3) {
          Output::Print(L"NativeCodeData Add Fixup: %p[%d](+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n",
                        startAddress,uVar10 & 0xffffffff,(ulong)pNVar8->addrOffset,pDVar5,data,
                        pDVar7,pDVar5->dataType);
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < pDVar5->len >> 3);
  }
  return;
}

Assistant:

void
NativeCodeData::AddFixupEntryForPointerArray(void* startAddress, DataChunk * chunkList)
{
    DataChunk* chunk = NativeCodeData::GetDataChunk(startAddress);
    Assert(chunk->len % sizeof(void*) == 0);
    for (unsigned int i = 0; i < chunk->len / sizeof(void*); i++)
    {
        size_t offset = i * sizeof(void*);
        void* targetAddr = *(void**)((char*)startAddress + offset);

        if (targetAddr == nullptr)
        {
            continue;
        }

        DataChunk* targetChunk = NativeCodeData::GetDataChunk(targetAddr);

#if DBG
        bool foundTargetChunk = false;
        DataChunk* chunk1 = chunkList;
        while (chunk1 && !foundTargetChunk)
        {
            foundTargetChunk = (chunk1 == targetChunk);
            chunk1 = chunk1->next;
        }
        AssertMsg(foundTargetChunk, "current pointer is not allocated with NativeCodeData allocator?"); // change to valid check instead of assertion?
#endif

        NativeDataFixupEntry* entry = (NativeDataFixupEntry*)midl_user_allocate(sizeof(NativeDataFixupEntry));
        if (!entry)
        {
            Js::Throw::OutOfMemory();
        }
        __analysis_assume(entry);
        entry->addrOffset = (unsigned int)offset;
        entry->targetTotalOffset = targetChunk->offset;
        entry->next = chunk->fixupList;
        chunk->fixupList = entry;

#if DBG
        if (PHASE_TRACE1(Js::NativeCodeDataPhase))
        {
            Output::Print(_u("NativeCodeData Add Fixup: %p[%d](+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n"),
                startAddress, i, entry->addrOffset, (void*)chunk, targetAddr, (void*)targetChunk, chunk->dataType);
        }
#endif
    }
}